

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int run_container_negation_range_inplace
              (run_container_t *src,int range_start,int range_end,container_t **dst)

{
  ushort pos;
  _Bool _Var1;
  _Bool _Var2;
  uint uVar3;
  ulong uVar4;
  container_t *pcVar5;
  ulong uVar6;
  uint16_t length;
  uint16_t uVar7;
  ushort start;
  uint16_t uVar8;
  uint8_t return_typecode;
  long local_40;
  container_t **local_38;
  
  if (range_end <= range_start) {
    *dst = src;
    return 3;
  }
  uVar3 = src->n_runs;
  local_40 = (long)(int)uVar3;
  uVar7 = (uint16_t)range_end;
  pos = (ushort)range_start;
  if (src->capacity == uVar3) {
    if (range_start < 1) {
      _Var1 = false;
    }
    else {
      _Var1 = run_container_contains(src,pos - 1);
    }
    _Var2 = run_container_contains(src,pos);
    uVar3 = (uint)local_40;
    if (_Var1 == _Var2) {
      _Var1 = run_container_contains(src,uVar7 - 1);
      _Var2 = false;
      if (range_end != 0x10000) {
        _Var2 = run_container_contains(src,uVar7);
      }
      uVar3 = (uint)local_40;
      if (_Var2 == _Var1) {
        uVar3 = run_container_negation_range(src,range_start,range_end,dst);
        goto LAB_0010c0f5;
      }
    }
  }
  src->n_runs = 0;
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  while (uVar6 != uVar4) {
    start = src->runs[uVar4].value;
    if (range_start <= (int)(uint)start) {
      length = src->runs[uVar4].length;
      uVar6 = uVar4;
      goto LAB_0010c075;
    }
    uVar4 = uVar4 + 1;
    src->n_runs = (int32_t)uVar4;
  }
  start = 0;
  length = 0;
LAB_0010c075:
  local_38 = dst;
  run_container_smart_append_exclusive(src,pos,~pos + uVar7);
  uVar8 = 0;
  uVar7 = 0;
  for (; (long)uVar6 < local_40; uVar6 = uVar6 + 1) {
    if ((int)uVar6 + 1 < (int)local_40) {
      uVar7 = src->runs[uVar6 + 1].value;
      uVar8 = src->runs[uVar6 + 1].length;
    }
    run_container_smart_append_exclusive(src,start,length);
    start = uVar7;
    length = uVar8;
  }
  pcVar5 = convert_run_to_efficient_container(src,&return_typecode);
  *local_38 = pcVar5;
  uVar3 = (uint)return_typecode;
  if (return_typecode == '\x03') {
    return (uint)return_typecode;
  }
LAB_0010c0f5:
  run_container_free(src);
  return uVar3;
}

Assistant:

int run_container_negation_range_inplace(
    run_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    uint8_t return_typecode;

    if (range_end <= range_start) {
        *dst = src;
        return RUN_CONTAINER_TYPE;
    }

    // TODO: efficient special case when range is 0 to 65535 inclusive

    if (src->capacity == src->n_runs) {
        // no excess room.  More checking to see if result can fit
        bool last_val_before_range = false;
        bool first_val_in_range = false;
        bool last_val_in_range = false;
        bool first_val_past_range = false;

        if (range_start > 0)
            last_val_before_range =
                run_container_contains(src, (uint16_t)(range_start - 1));
        first_val_in_range = run_container_contains(src, (uint16_t)range_start);

        if (last_val_before_range == first_val_in_range) {
            last_val_in_range =
                run_container_contains(src, (uint16_t)(range_end - 1));
            if (range_end != 0x10000)
                first_val_past_range =
                    run_container_contains(src, (uint16_t)range_end);

            if (last_val_in_range ==
                first_val_past_range) {  // no space for inplace
                int ans = run_container_negation_range(src, range_start,
                                                       range_end, dst);
                run_container_free(src);
                return ans;
            }
        }
    }
    // all other cases: result will fit

    run_container_t *ans = src;
    int my_nbr_runs = src->n_runs;

    ans->n_runs = 0;
    int k = 0;
    for (; (k < my_nbr_runs) && (src->runs[k].value < range_start); ++k) {
        // ans->runs[k] = src->runs[k]; (would be self-copy)
        ans->n_runs++;
    }

    // as with Java implementation, use locals to give self a buffer of depth 1
    rle16_t buffered = MAKE_RLE16(0, 0);
    rle16_t next = buffered;
    if (k < my_nbr_runs) buffered = src->runs[k];

    run_container_smart_append_exclusive(
        ans, (uint16_t)range_start, (uint16_t)(range_end - range_start - 1));

    for (; k < my_nbr_runs; ++k) {
        if (k + 1 < my_nbr_runs) next = src->runs[k + 1];

        run_container_smart_append_exclusive(ans, buffered.value,
                                             buffered.length);
        buffered = next;
    }

    *dst = convert_run_to_efficient_container(ans, &return_typecode);
    if (return_typecode != RUN_CONTAINER_TYPE) run_container_free(ans);

    return return_typecode;
}